

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

void leveldb::WriteBatchInternal::SetContents(WriteBatch *b,Slice *contents)

{
  if (0xb < contents->size_) {
    std::__cxx11::string::assign((char *)b,(ulong)contents->data_);
    return;
  }
  __assert_fail("contents.size() >= kHeader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch.cc"
                ,0x8c,
                "static void leveldb::WriteBatchInternal::SetContents(WriteBatch *, const Slice &)")
  ;
}

Assistant:

size_t size() const { return size_; }